

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::ScriptSet::displayScripts(ScriptSet *this,UnicodeString *dest)

{
  UScriptCode scriptCode;
  char *src;
  bool bVar1;
  UnicodeString local_70;
  
  bVar1 = false;
  scriptCode = nextSetBit(this,0);
  while (USCRIPT_INVALID_CODE < scriptCode) {
    if (bVar1) {
      UnicodeString::append(dest,L' ');
    }
    src = uscript_getShortName_63(scriptCode);
    UnicodeString::UnicodeString(&local_70,src,-1,kInvariant);
    UnicodeString::append(dest,&local_70);
    UnicodeString::~UnicodeString(&local_70);
    scriptCode = nextSetBit(this,scriptCode + USCRIPT_INHERITED);
    bVar1 = true;
  }
  return dest;
}

Assistant:

UnicodeString &ScriptSet::displayScripts(UnicodeString &dest) const {
    UBool firstTime = TRUE;
    for (int32_t i = nextSetBit(0); i >= 0; i = nextSetBit(i + 1)) {
        if (!firstTime) {
            dest.append((UChar)0x20);
        }
        firstTime = FALSE;
        const char *scriptName = uscript_getShortName((UScriptCode(i)));
        dest.append(UnicodeString(scriptName, -1, US_INV));
    }
    return dest;
}